

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::truncateRecording
          (ArchiveProxy *this,int64_t recordingId,int64_t position,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  TruncateRecordingRequest *pTVar2;
  uint64_t uVar3;
  undefined1 local_68 [8];
  TruncateRecordingRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t position_local;
  int64_t recordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::TruncateRecordingRequest::TruncateRecordingRequest
            ((TruncateRecordingRequest *)local_68);
  pTVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::TruncateRecordingRequest>
                     (this,(TruncateRecordingRequest *)local_68);
  pTVar2 = io::aeron::archive::codecs::TruncateRecordingRequest::controlSessionId
                     (pTVar2,msg.m_actingVersion);
  pTVar2 = io::aeron::archive::codecs::TruncateRecordingRequest::correlationId(pTVar2,correlationId)
  ;
  pTVar2 = io::aeron::archive::codecs::TruncateRecordingRequest::recordingId(pTVar2,recordingId);
  io::aeron::archive::codecs::TruncateRecordingRequest::position(pTVar2,position);
  uVar3 = io::aeron::archive::codecs::TruncateRecordingRequest::encodedLength
                    ((TruncateRecordingRequest *)local_68);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::truncateRecording(std::int64_t recordingId, std::int64_t position, std::int64_t correlationId,
                                     std::int64_t controlSessionId) {
    codecs::TruncateRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .position(position);

    return offer(msg.encodedLength());
}